

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

void skiwi::skiwi_show_external_primitives(string *arg)

{
  bool bVar1;
  reference args_1;
  ulong uVar2;
  reference pcVar3;
  ulong local_90;
  size_t pos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_80;
  int count;
  iterator it_end;
  iterator it;
  string txt;
  external_primitive *p;
  iterator __end1;
  iterator __begin1;
  vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>
  *__range1;
  string *arg_local;
  
  __end1 = std::
           vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>
           ::begin((vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>
                    *)(anonymous_namespace)::external_primitives);
  p = (external_primitive *)
      std::
      vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>
      ::end((vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>
             *)(anonymous_namespace)::external_primitives);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<skiwi::(anonymous_namespace)::external_primitive_*,_std::vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>_>
                                *)&p);
    if (!bVar1) {
      return;
    }
    args_1 = __gnu_cxx::
             __normal_iterator<skiwi::(anonymous_namespace)::external_primitive_*,_std::vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>_>
             ::operator*(&__end1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)((long)&txt.field_2 + 8),(ulong)args_1);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&txt.field_2 + 8),arg);
      std::__cxx11::string::~string((string *)(txt.field_2._M_local_buf + 8));
      if (!bVar1) goto LAB_004219f4;
    }
    else {
LAB_004219f4:
      (anonymous_namespace)::out<char_const(&)[6]>((char (*) [6])"NAME\n");
      (anonymous_namespace)::out<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
                ((char (*) [2])0x4e6cab,&args_1->name,(char (*) [2])0x4e6c28);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::string((string *)&it,(string *)&args_1->help_text);
        it_end._M_current = (char *)std::__cxx11::string::begin();
        _Stack_80._M_current = (char *)std::__cxx11::string::end();
        pos._4_4_ = 0;
        while (bVar1 = __gnu_cxx::operator!=(&it_end,&stack0xffffffffffffff80), bVar1) {
          if ((0x32 < pos._4_4_) &&
             (pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&it_end), *pcVar3 == ' ')) {
            pos._4_4_ = 0;
            pcVar3 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&it_end);
            *pcVar3 = '\n';
          }
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&it_end);
          pos._4_4_ = pos._4_4_ + 1;
        }
        local_90 = std::__cxx11::string::find((char *)&it,0x4e6c28);
        while (local_90 != 0xffffffffffffffff) {
          std::__cxx11::string::replace((ulong)&it,local_90,(char *)0x1);
          local_90 = std::__cxx11::string::find((char *)&it,0x4e6c28);
        }
        (anonymous_namespace)::out<char_const(&)[13]>((char (*) [13])"DESCRIPTION\n");
        (anonymous_namespace)::out<char_const(&)[2],std::__cxx11::string&,char_const(&)[3]>
                  ((char (*) [2])0x4e6cab,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   (char (*) [3])0x4e6c27);
        std::__cxx11::string::~string((string *)&it);
      }
    }
    __gnu_cxx::
    __normal_iterator<skiwi::(anonymous_namespace)::external_primitive_*,_std::vector<skiwi::(anonymous_namespace)::external_primitive,_std::allocator<skiwi::(anonymous_namespace)::external_primitive>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void skiwi_show_external_primitives(const std::string& arg)
  {
  for (const auto& p : external_primitives)
    {
    if (!arg.empty())
      {
      if (p.name.substr(0, arg.length()) != arg)
        continue;
      }
    out("NAME\n");
    out("\t", p.name, "\n");
    if (!p.help_text.empty())
      {
      std::string txt = p.help_text;
      auto it = txt.begin();
      auto it_end = txt.end();
      int count = 0;
      for (; it != it_end; ++it, ++count)
        {
        if (count > 50 && *it == ' ')
          {
          count = 0;
          *it = '\n';
          }
        }
      size_t pos = txt.find("\n");
      while (pos != std::string::npos)
        {
        txt.replace(pos, 1, "\n\t");
        pos = txt.find("\n", pos + 2);
        }
      out("DESCRIPTION\n");
      out("\t", txt, "\n\n");
      }
    }
  }